

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

bool qt_isect_curve_horizontal(QBezier *bezier,qreal y,qreal x1,qreal x2,int depth)

{
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  double dVar3;
  double dVar4;
  QBezier local_c8;
  QBezier local_88;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0xffffffff;
  uStack_34 = 0xffffffff;
  uStack_30 = 0xffffffff;
  uStack_2c = 0xffffffff;
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  QBezier::bounds(bezier);
  if (((((double)CONCAT44(uStack_3c,uStack_40) <= y) &&
       (y < (double)CONCAT44(uStack_3c,uStack_40) + (double)CONCAT44(uStack_2c,uStack_30))) &&
      ((double)CONCAT44(uStack_44,local_48) < x2)) &&
     (x1 <= (double)CONCAT44(uStack_44,local_48) + (double)CONCAT44(uStack_34,local_38))) {
    bVar2 = true;
    if ((depth == 0x20) ||
       (((double)CONCAT44(uStack_2c,uStack_30) < 0.01 &&
        ((double)CONCAT44(uStack_34,local_38) < 0.01)))) goto LAB_003e6cf0;
    local_c8.x1 = bezier->x1;
    local_c8.y1 = bezier->y1;
    local_c8.x2 = (local_c8.x1 + bezier->x2) * 0.5;
    local_c8.y2 = (local_c8.y1 + bezier->y2) * 0.5;
    dVar3 = (bezier->x2 + bezier->x3) * 0.5;
    dVar4 = (bezier->y2 + bezier->y3) * 0.5;
    local_c8.x3 = (local_c8.x2 + dVar3) * 0.5;
    local_c8.y3 = (local_c8.y2 + dVar4) * 0.5;
    local_88.x4 = bezier->x4;
    local_88.y4 = bezier->y4;
    local_88.x3 = (bezier->x3 + local_88.x4) * 0.5;
    local_88.y3 = (bezier->y3 + local_88.y4) * 0.5;
    local_88.x2 = (dVar3 + local_88.x3) * 0.5;
    local_88.y2 = (dVar4 + local_88.y3) * 0.5;
    local_c8.x4 = (local_c8.x3 + local_88.x2) * 0.5;
    local_c8.y4 = (local_c8.y3 + local_88.y2) * 0.5;
    local_88.x1 = local_c8.x4;
    local_88.y1 = local_c8.y4;
    bVar1 = qt_isect_curve_horizontal(&local_c8,y,x1,x2,depth + 1);
    if (bVar1) goto LAB_003e6cf0;
    bVar1 = qt_isect_curve_horizontal(&local_88,y,x1,x2,depth + 1);
    if (bVar1) goto LAB_003e6cf0;
  }
  bVar2 = false;
LAB_003e6cf0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool qt_isect_curve_horizontal(const QBezier &bezier, qreal y, qreal x1, qreal x2, int depth = 0)
{
    QRectF bounds = bezier.bounds();

    if (y >= bounds.top() && y < bounds.bottom()
        && bounds.right() >= x1 && bounds.left() < x2) {
        const qreal lower_bound = qreal(.01);
        if (depth == 32 || (bounds.width() < lower_bound && bounds.height() < lower_bound))
            return true;

        const auto halves = bezier.split();
        if (qt_isect_curve_horizontal(halves.first, y, x1, x2, depth + 1)
            || qt_isect_curve_horizontal(halves.second, y, x1, x2, depth + 1))
            return true;
    }
    return false;
}